

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

int xmlStreamCtxtAddState(xmlStreamCtxtPtr comp,int idx,int level)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  
  iVar5 = comp->nbState;
  if (0 < (long)iVar5) {
    piVar4 = comp->states;
    uVar3 = 0;
    do {
      if (piVar4[uVar3 * 2] < 0) {
        piVar4[uVar3 * 2] = idx;
        piVar4[uVar3 * 2 + 1] = level;
        goto LAB_001751ae;
      }
      uVar3 = uVar3 + 1;
    } while ((long)iVar5 != uVar3);
  }
  uVar1 = comp->maxState;
  if (iVar5 < (int)uVar1) {
    piVar4 = comp->states;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar3 = 4;
    }
    else {
      uVar3 = 0xffffffff;
      if (999999999 < uVar1) goto LAB_001751ae;
      uVar6 = uVar1 + 1 >> 1;
      uVar2 = uVar6 + uVar1;
      if (1000000000 - uVar6 < uVar1) {
        uVar2 = 1000000000;
      }
      uVar3 = (ulong)uVar2;
    }
    piVar4 = (int *)(*xmlRealloc)(comp->states,uVar3 << 3);
    if (piVar4 == (int *)0x0) {
      uVar3 = 0xffffffff;
      goto LAB_001751ae;
    }
    comp->states = piVar4;
    comp->maxState = (int)uVar3;
    iVar5 = comp->nbState;
  }
  piVar4[iVar5 * 2] = idx;
  iVar5 = comp->nbState;
  comp->nbState = iVar5 + 1;
  piVar4[(long)iVar5 * 2 + 1] = level;
  uVar3 = (ulong)(comp->nbState - 1);
LAB_001751ae:
  return (int)uVar3;
}

Assistant:

static int
xmlStreamCtxtAddState(xmlStreamCtxtPtr comp, int idx, int level) {
    int i;
    for (i = 0;i < comp->nbState;i++) {
        if (comp->states[2 * i] < 0) {
	    comp->states[2 * i] = idx;
	    comp->states[2 * i + 1] = level;
	    return(i);
	}
    }
    if (comp->nbState >= comp->maxState) {
        int *tmp;
        int newSize;

        newSize = xmlGrowCapacity(comp->maxState, sizeof(tmp[0]) * 2,
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: growCapacity failed\n");
	    return(-1);
        }
	tmp = xmlRealloc(comp->states, newSize * sizeof(tmp[0]) * 2);
	if (tmp == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: malloc failed\n");
	    return(-1);
	}
	comp->states = tmp;
        comp->maxState = newSize;
    }
    comp->states[2 * comp->nbState] = idx;
    comp->states[2 * comp->nbState++ + 1] = level;
    return(comp->nbState - 1);
}